

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_affixutils.cpp
# Opt level: O2

AffixTag __thiscall
icu_63::number::impl::AffixUtils::nextToken
          (AffixUtils *this,AffixTag tag,UnicodeString *patternString,UErrorCode *status)

{
  short sVar1;
  int iVar2;
  uint uVar3;
  uint *puVar4;
  ulong uVar5;
  UnicodeString *this_00;
  int offset;
  undefined8 uVar6;
  AffixTag AVar7;
  
  this_00 = tag._8_8_;
  uVar5 = tag._0_8_;
  uVar6 = 0xfffffffb00000000;
switchD_002537f5_default:
  sVar1 = (this_00->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    iVar2 = (this_00->fUnion).fFields.fLength;
  }
  else {
    iVar2 = (int)sVar1 >> 5;
  }
  offset = (int)this;
  if (offset < iVar2) goto code_r0x002537da;
  puVar4 = &switchD_002538ec::switchdataD_002e7dd8;
  switch((int)uVar5) {
  case 1:
  case 2:
    *(undefined4 *)&(patternString->super_Replaceable).super_UObject._vptr_UObject = 1;
    puVar4 = (uint *)patternString;
  default:
    this = (AffixUtils *)0xffffffff;
    break;
  case 4:
    goto switchD_002538ec_caseD_4;
  case 5:
    goto switchD_002538ec_caseD_5;
  case 6:
    goto switchD_002538ec_caseD_6;
  case 7:
    goto switchD_002538ec_caseD_7;
  case 8:
    goto switchD_002538ec_caseD_8;
  case 9:
    goto switchD_002538ec_caseD_9;
  }
  goto LAB_002539d1;
code_r0x002537da:
  uVar3 = UnicodeString::char32At(this_00,offset);
  puVar4 = (uint *)(ulong)uVar3;
  switch(uVar5 & 0xffffffff) {
  case 0:
    switch(uVar3) {
    case 0x25:
      this = (AffixUtils *)(ulong)(offset + 1);
      puVar4 = (uint *)0x0;
      uVar6 = 0xfffffffd00000000;
      goto LAB_002539d1;
    case 0x26:
    case 0x28:
    case 0x29:
    case 0x2a:
    case 0x2c:
      goto switchD_00253811_caseD_26;
    case 0x27:
      this = (AffixUtils *)(ulong)(offset + 1);
      uVar5 = 1;
      goto switchD_002537f5_default;
    case 0x2b:
      this = (AffixUtils *)(ulong)(offset + 1);
      puVar4 = (uint *)0x0;
      uVar6 = 0xfffffffe00000000;
      goto LAB_002539d1;
    case 0x2d:
      this = (AffixUtils *)(ulong)(offset + 1);
      puVar4 = (uint *)0x0;
      uVar6 = 0xffffffff00000000;
      goto LAB_002539d1;
    default:
      if (uVar3 == 0xa4) {
        this = (AffixUtils *)(ulong)(offset + 1);
        uVar5 = 4;
        goto switchD_002537f5_default;
      }
      if (uVar3 == 0x2030) {
        this = (AffixUtils *)(ulong)(offset + 1);
        puVar4 = (uint *)0x0;
        uVar6 = 0xfffffffc00000000;
        goto LAB_002539d1;
      }
switchD_00253811_caseD_26:
      uVar3 = (offset - (uint)(uVar3 < 0x10000)) + 2;
      goto LAB_0025399e;
    }
  case 1:
    goto switchD_002537f5_caseD_1;
  case 2:
    if (uVar3 != 0x27) goto LAB_00253964;
    this = (AffixUtils *)(ulong)(offset + 1);
    uVar5 = 3;
    goto switchD_002537f5_default;
  case 3:
    uVar5 = 0;
    if (uVar3 == 0x27) {
      uVar3 = offset + 1;
      puVar4 = (uint *)0x27;
      goto LAB_00253976;
    }
    goto switchD_002537f5_default;
  case 4:
    if (uVar3 != 0xa4) {
switchD_002538ec_caseD_4:
      puVar4 = (uint *)0x0;
      goto LAB_002539d1;
    }
    this = (AffixUtils *)(ulong)(offset + 1);
    uVar5 = 5;
    goto switchD_002537f5_default;
  case 5:
    if (uVar3 != 0xa4) {
switchD_002538ec_caseD_5:
      puVar4 = (uint *)0x0;
      uVar6 = 0xfffffffa00000000;
      goto LAB_002539d1;
    }
    this = (AffixUtils *)(ulong)(offset + 1);
    uVar5 = 6;
    goto switchD_002537f5_default;
  case 6:
    if (uVar3 != 0xa4) {
switchD_002538ec_caseD_6:
      puVar4 = (uint *)0x0;
      uVar6 = 0xfffffff900000000;
      goto LAB_002539d1;
    }
    this = (AffixUtils *)(ulong)(offset + 1);
    uVar5 = 7;
    goto switchD_002537f5_default;
  case 7:
    if (uVar3 != 0xa4) {
switchD_002538ec_caseD_7:
      puVar4 = (uint *)0x0;
      uVar6 = 0xfffffff800000000;
      goto LAB_002539d1;
    }
    this = (AffixUtils *)(ulong)(offset + 1);
    uVar5 = 8;
    goto switchD_002537f5_default;
  case 8:
    if (uVar3 != 0xa4) {
switchD_002538ec_caseD_8:
      puVar4 = (uint *)0x0;
      uVar6 = 0xfffffff700000000;
      goto LAB_002539d1;
    }
    break;
  case 9:
    if (uVar3 != 0xa4) {
switchD_002538ec_caseD_9:
      puVar4 = (uint *)0x0;
      uVar6 = 0xfffffff100000000;
      goto LAB_002539d1;
    }
    break;
  default:
    goto switchD_002537f5_default;
  }
  this = (AffixUtils *)(ulong)(offset + 1);
  uVar5 = 9;
  goto switchD_002537f5_default;
switchD_002537f5_caseD_1:
  if (uVar3 == 0x27) {
    uVar3 = offset + 1;
    puVar4 = (uint *)0x27;
LAB_0025399e:
    this = (AffixUtils *)(ulong)uVar3;
    uVar6 = 0;
  }
  else {
LAB_00253964:
    uVar3 = (offset - (uint)(uVar3 < 0x10000)) + 2;
LAB_00253976:
    this = (AffixUtils *)(ulong)uVar3;
    uVar6 = 2;
  }
LAB_002539d1:
  uVar5 = (ulong)this & 0xffffffff | (long)puVar4 << 0x20;
  AVar7.state = (int)uVar6;
  AVar7.type = (int)((ulong)uVar6 >> 0x20);
  AVar7.offset = (int)uVar5;
  AVar7.codePoint = (int)(uVar5 >> 0x20);
  return AVar7;
}

Assistant:

AffixTag AffixUtils::nextToken(AffixTag tag, const UnicodeString &patternString, UErrorCode &status) {
    int32_t offset = tag.offset;
    int32_t state = tag.state;
    for (; offset < patternString.length();) {
        UChar32 cp = patternString.char32At(offset);
        int32_t count = U16_LENGTH(cp);

        switch (state) {
            case STATE_BASE:
                switch (cp) {
                    case u'\'':
                        state = STATE_FIRST_QUOTE;
                        offset += count;
                        // continue to the next code point
                        break;
                    case u'-':
                        return makeTag(offset + count, TYPE_MINUS_SIGN, STATE_BASE, 0);
                    case u'+':
                        return makeTag(offset + count, TYPE_PLUS_SIGN, STATE_BASE, 0);
                    case u'%':
                        return makeTag(offset + count, TYPE_PERCENT, STATE_BASE, 0);
                    case u'‰':
                        return makeTag(offset + count, TYPE_PERMILLE, STATE_BASE, 0);
                    case u'¤':
                        state = STATE_FIRST_CURR;
                        offset += count;
                        // continue to the next code point
                        break;
                    default:
                        return makeTag(offset + count, TYPE_CODEPOINT, STATE_BASE, cp);
                }
                break;
            case STATE_FIRST_QUOTE:
                if (cp == u'\'') {
                    return makeTag(offset + count, TYPE_CODEPOINT, STATE_BASE, cp);
                } else {
                    return makeTag(offset + count, TYPE_CODEPOINT, STATE_INSIDE_QUOTE, cp);
                }
            case STATE_INSIDE_QUOTE:
                if (cp == u'\'') {
                    state = STATE_AFTER_QUOTE;
                    offset += count;
                    // continue to the next code point
                    break;
                } else {
                    return makeTag(offset + count, TYPE_CODEPOINT, STATE_INSIDE_QUOTE, cp);
                }
            case STATE_AFTER_QUOTE:
                if (cp == u'\'') {
                    return makeTag(offset + count, TYPE_CODEPOINT, STATE_INSIDE_QUOTE, cp);
                } else {
                    state = STATE_BASE;
                    // re-evaluate this code point
                    break;
                }
            case STATE_FIRST_CURR:
                if (cp == u'¤') {
                    state = STATE_SECOND_CURR;
                    offset += count;
                    // continue to the next code point
                    break;
                } else {
                    return makeTag(offset, TYPE_CURRENCY_SINGLE, STATE_BASE, 0);
                }
            case STATE_SECOND_CURR:
                if (cp == u'¤') {
                    state = STATE_THIRD_CURR;
                    offset += count;
                    // continue to the next code point
                    break;
                } else {
                    return makeTag(offset, TYPE_CURRENCY_DOUBLE, STATE_BASE, 0);
                }
            case STATE_THIRD_CURR:
                if (cp == u'¤') {
                    state = STATE_FOURTH_CURR;
                    offset += count;
                    // continue to the next code point
                    break;
                } else {
                    return makeTag(offset, TYPE_CURRENCY_TRIPLE, STATE_BASE, 0);
                }
            case STATE_FOURTH_CURR:
                if (cp == u'¤') {
                    state = STATE_FIFTH_CURR;
                    offset += count;
                    // continue to the next code point
                    break;
                } else {
                    return makeTag(offset, TYPE_CURRENCY_QUAD, STATE_BASE, 0);
                }
            case STATE_FIFTH_CURR:
                if (cp == u'¤') {
                    state = STATE_OVERFLOW_CURR;
                    offset += count;
                    // continue to the next code point
                    break;
                } else {
                    return makeTag(offset, TYPE_CURRENCY_QUINT, STATE_BASE, 0);
                }
            case STATE_OVERFLOW_CURR:
                if (cp == u'¤') {
                    offset += count;
                    // continue to the next code point and loop back to this state
                    break;
                } else {
                    return makeTag(offset, TYPE_CURRENCY_OVERFLOW, STATE_BASE, 0);
                }
            default:
                U_ASSERT(false);
        }
    }
    // End of string
    switch (state) {
        case STATE_BASE:
            // No more tokens in string.
            return {-1};
        case STATE_FIRST_QUOTE:
        case STATE_INSIDE_QUOTE:
            // For consistent behavior with the JDK and ICU 58, set an error here.
            status = U_ILLEGAL_ARGUMENT_ERROR;
            return {-1};
        case STATE_AFTER_QUOTE:
            // No more tokens in string.
            return {-1};
        case STATE_FIRST_CURR:
            return makeTag(offset, TYPE_CURRENCY_SINGLE, STATE_BASE, 0);
        case STATE_SECOND_CURR:
            return makeTag(offset, TYPE_CURRENCY_DOUBLE, STATE_BASE, 0);
        case STATE_THIRD_CURR:
            return makeTag(offset, TYPE_CURRENCY_TRIPLE, STATE_BASE, 0);
        case STATE_FOURTH_CURR:
            return makeTag(offset, TYPE_CURRENCY_QUAD, STATE_BASE, 0);
        case STATE_FIFTH_CURR:
            return makeTag(offset, TYPE_CURRENCY_QUINT, STATE_BASE, 0);
        case STATE_OVERFLOW_CURR:
            return makeTag(offset, TYPE_CURRENCY_OVERFLOW, STATE_BASE, 0);
        default:
            U_ASSERT(false);
            return {-1}; // suppress "control reaches end of non-void function"
    }
}